

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_diag_sse41_128_8.c
# Opt level: O0

void arr_store_rowcol(int *row,int *col,__m256i vWH,int32_t i,int32_t s1Len,int32_t j,int32_t s2Len)

{
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 in_XMM0_Qa;
  undefined8 in_YMM0_H;
  undefined1 local_60;
  undefined1 uStack_5f;
  undefined1 uStack_5e;
  undefined1 uStack_5d;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  undefined1 uStack_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  
  uStack_49 = (char)((ulong)in_YMM0_H >> 0x38);
  if (((in_EDX == in_ECX + -1) && (-1 < in_R8D)) && (in_R8D < in_R9D)) {
    *(int *)(in_RDI + (long)in_R8D * 4) = (int)uStack_49;
  }
  if (((in_R8D == in_R9D + -1) && (-1 < in_EDX)) && (in_EDX < in_ECX)) {
    *(int *)(in_RSI + (long)in_EDX * 4) = (int)uStack_49;
  }
  uStack_4a = (char)((ulong)in_YMM0_H >> 0x30);
  if (((in_EDX + 1 == in_ECX + -1) && (-1 < in_R8D + -1)) && (in_R8D + -1 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -1) * 4) = (int)uStack_4a;
  }
  if (((in_R8D + -1 == in_R9D + -1) && (-1 < in_EDX + 1)) && (in_EDX + 1 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 1) * 4) = (int)uStack_4a;
  }
  uStack_4b = (char)((ulong)in_YMM0_H >> 0x28);
  if (((in_EDX + 2 == in_ECX + -1) && (-1 < in_R8D + -2)) && (in_R8D + -2 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -2) * 4) = (int)uStack_4b;
  }
  if (((in_R8D + -2 == in_R9D + -1) && (-1 < in_EDX + 2)) && (in_EDX + 2 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 2) * 4) = (int)uStack_4b;
  }
  uStack_4c = (char)((ulong)in_YMM0_H >> 0x20);
  if (((in_EDX + 3 == in_ECX + -1) && (-1 < in_R8D + -3)) && (in_R8D + -3 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -3) * 4) = (int)uStack_4c;
  }
  if (((in_R8D + -3 == in_R9D + -1) && (-1 < in_EDX + 3)) && (in_EDX + 3 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 3) * 4) = (int)uStack_4c;
  }
  uStack_4d = (char)((ulong)in_YMM0_H >> 0x18);
  if (((in_EDX + 4 == in_ECX + -1) && (-1 < in_R8D + -4)) && (in_R8D + -4 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -4) * 4) = (int)uStack_4d;
  }
  if (((in_R8D + -4 == in_R9D + -1) && (-1 < in_EDX + 4)) && (in_EDX + 4 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 4) * 4) = (int)uStack_4d;
  }
  uStack_4e = (char)((ulong)in_YMM0_H >> 0x10);
  if (((in_EDX + 5 == in_ECX + -1) && (-1 < in_R8D + -5)) && (in_R8D + -5 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -5) * 4) = (int)uStack_4e;
  }
  if (((in_R8D + -5 == in_R9D + -1) && (-1 < in_EDX + 5)) && (in_EDX + 5 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 5) * 4) = (int)uStack_4e;
  }
  uStack_4f = (char)((ulong)in_YMM0_H >> 8);
  if (((in_EDX + 6 == in_ECX + -1) && (-1 < in_R8D + -6)) && (in_R8D + -6 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -6) * 4) = (int)uStack_4f;
  }
  if (((in_R8D + -6 == in_R9D + -1) && (-1 < in_EDX + 6)) && (in_EDX + 6 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 6) * 4) = (int)uStack_4f;
  }
  uStack_50 = (char)in_YMM0_H;
  if (((in_EDX + 7 == in_ECX + -1) && (-1 < in_R8D + -7)) && (in_R8D + -7 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -7) * 4) = (int)uStack_50;
  }
  if (((in_R8D + -7 == in_R9D + -1) && (-1 < in_EDX + 7)) && (in_EDX + 7 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 7) * 4) = (int)uStack_50;
  }
  if (((in_EDX + 8 == in_ECX + -1) && (-1 < in_R8D + -8)) && (in_R8D + -8 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -8) * 4) = (int)uStack_49;
  }
  if (((in_R8D + -8 == in_R9D + -1) && (-1 < in_EDX + 8)) && (in_EDX + 8 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 8) * 4) = (int)uStack_49;
  }
  if (((in_EDX + 9 == in_ECX + -1) && (-1 < in_R8D + -9)) && (in_R8D + -9 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -9) * 4) = (int)uStack_4a;
  }
  if (((in_R8D + -9 == in_R9D + -1) && (-1 < in_EDX + 9)) && (in_EDX + 9 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 9) * 4) = (int)uStack_4a;
  }
  if (((in_EDX + 10 == in_ECX + -1) && (-1 < in_R8D + -10)) && (in_R8D + -10 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -10) * 4) = (int)uStack_4b;
  }
  if (((in_R8D + -10 == in_R9D + -1) && (-1 < in_EDX + 10)) && (in_EDX + 10 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 10) * 4) = (int)uStack_4b;
  }
  if (((in_EDX + 0xb == in_ECX + -1) && (-1 < in_R8D + -0xb)) && (in_R8D + -0xb < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0xb) * 4) = (int)uStack_4c;
  }
  if (((in_R8D + -0xb == in_R9D + -1) && (-1 < in_EDX + 0xb)) && (in_EDX + 0xb < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0xb) * 4) = (int)uStack_4c;
  }
  if (((in_EDX + 0xc == in_ECX + -1) && (-1 < in_R8D + -0xc)) && (in_R8D + -0xc < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0xc) * 4) = (int)uStack_4d;
  }
  if (((in_R8D + -0xc == in_R9D + -1) && (-1 < in_EDX + 0xc)) && (in_EDX + 0xc < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0xc) * 4) = (int)uStack_4d;
  }
  if (((in_EDX + 0xd == in_ECX + -1) && (-1 < in_R8D + -0xd)) && (in_R8D + -0xd < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0xd) * 4) = (int)uStack_4e;
  }
  if (((in_R8D + -0xd == in_R9D + -1) && (-1 < in_EDX + 0xd)) && (in_EDX + 0xd < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0xd) * 4) = (int)uStack_4e;
  }
  if (((in_EDX + 0xe == in_ECX + -1) && (-1 < in_R8D + -0xe)) && (in_R8D + -0xe < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0xe) * 4) = (int)uStack_4f;
  }
  if (((in_R8D + -0xe == in_R9D + -1) && (-1 < in_EDX + 0xe)) && (in_EDX + 0xe < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0xe) * 4) = (int)uStack_4f;
  }
  if (((in_EDX + 0xf == in_ECX + -1) && (-1 < in_R8D + -0xf)) && (in_R8D + -0xf < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0xf) * 4) = (int)uStack_50;
  }
  if (((in_R8D + -0xf == in_R9D + -1) && (-1 < in_EDX + 0xf)) && (in_EDX + 0xf < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0xf) * 4) = (int)uStack_50;
  }
  uStack_59 = (char)((ulong)in_XMM0_Qa >> 0x38);
  if (((in_EDX + 0x10 == in_ECX + -1) && (-1 < in_R8D + -0x10)) && (in_R8D + -0x10 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0x10) * 4) = (int)uStack_59;
  }
  if (((in_R8D + -0x10 == in_R9D + -1) && (-1 < in_EDX + 0x10)) && (in_EDX + 0x10 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0x10) * 4) = (int)uStack_59;
  }
  uStack_5a = (char)((ulong)in_XMM0_Qa >> 0x30);
  if (((in_EDX + 0x11 == in_ECX + -1) && (-1 < in_R8D + -0x11)) && (in_R8D + -0x11 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0x11) * 4) = (int)uStack_5a;
  }
  if (((in_R8D + -0x11 == in_R9D + -1) && (-1 < in_EDX + 0x11)) && (in_EDX + 0x11 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0x11) * 4) = (int)uStack_5a;
  }
  uStack_5b = (char)((ulong)in_XMM0_Qa >> 0x28);
  if (((in_EDX + 0x12 == in_ECX + -1) && (-1 < in_R8D + -0x12)) && (in_R8D + -0x12 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0x12) * 4) = (int)uStack_5b;
  }
  if (((in_R8D + -0x12 == in_R9D + -1) && (-1 < in_EDX + 0x12)) && (in_EDX + 0x12 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0x12) * 4) = (int)uStack_5b;
  }
  uStack_5c = (char)((ulong)in_XMM0_Qa >> 0x20);
  if (((in_EDX + 0x13 == in_ECX + -1) && (-1 < in_R8D + -0x13)) && (in_R8D + -0x13 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0x13) * 4) = (int)uStack_5c;
  }
  if (((in_R8D + -0x13 == in_R9D + -1) && (-1 < in_EDX + 0x13)) && (in_EDX + 0x13 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0x13) * 4) = (int)uStack_5c;
  }
  uStack_5d = (char)((ulong)in_XMM0_Qa >> 0x18);
  if (((in_EDX + 0x14 == in_ECX + -1) && (-1 < in_R8D + -0x14)) && (in_R8D + -0x14 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0x14) * 4) = (int)uStack_5d;
  }
  if (((in_R8D + -0x14 == in_R9D + -1) && (-1 < in_EDX + 0x14)) && (in_EDX + 0x14 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0x14) * 4) = (int)uStack_5d;
  }
  uStack_5e = (char)((ulong)in_XMM0_Qa >> 0x10);
  if (((in_EDX + 0x15 == in_ECX + -1) && (-1 < in_R8D + -0x15)) && (in_R8D + -0x15 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0x15) * 4) = (int)uStack_5e;
  }
  if (((in_R8D + -0x15 == in_R9D + -1) && (-1 < in_EDX + 0x15)) && (in_EDX + 0x15 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0x15) * 4) = (int)uStack_5e;
  }
  uStack_5f = (char)((ulong)in_XMM0_Qa >> 8);
  if (((in_EDX + 0x16 == in_ECX + -1) && (-1 < in_R8D + -0x16)) && (in_R8D + -0x16 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0x16) * 4) = (int)uStack_5f;
  }
  if (((in_R8D + -0x16 == in_R9D + -1) && (-1 < in_EDX + 0x16)) && (in_EDX + 0x16 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0x16) * 4) = (int)uStack_5f;
  }
  local_60 = (char)in_XMM0_Qa;
  if (((in_EDX + 0x17 == in_ECX + -1) && (-1 < in_R8D + -0x17)) && (in_R8D + -0x17 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0x17) * 4) = (int)local_60;
  }
  if (((in_R8D + -0x17 == in_R9D + -1) && (-1 < in_EDX + 0x17)) && (in_EDX + 0x17 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0x17) * 4) = (int)local_60;
  }
  if (((in_EDX + 0x18 == in_ECX + -1) && (-1 < in_R8D + -0x18)) && (in_R8D + -0x18 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0x18) * 4) = (int)uStack_59;
  }
  if (((in_R8D + -0x18 == in_R9D + -1) && (-1 < in_EDX + 0x18)) && (in_EDX + 0x18 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0x18) * 4) = (int)uStack_59;
  }
  if (((in_EDX + 0x19 == in_ECX + -1) && (-1 < in_R8D + -0x19)) && (in_R8D + -0x19 < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0x19) * 4) = (int)uStack_5a;
  }
  if (((in_R8D + -0x19 == in_R9D + -1) && (-1 < in_EDX + 0x19)) && (in_EDX + 0x19 < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0x19) * 4) = (int)uStack_5a;
  }
  if (((in_EDX + 0x1a == in_ECX + -1) && (-1 < in_R8D + -0x1a)) && (in_R8D + -0x1a < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0x1a) * 4) = (int)uStack_5b;
  }
  if (((in_R8D + -0x1a == in_R9D + -1) && (-1 < in_EDX + 0x1a)) && (in_EDX + 0x1a < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0x1a) * 4) = (int)uStack_5b;
  }
  if (((in_EDX + 0x1b == in_ECX + -1) && (-1 < in_R8D + -0x1b)) && (in_R8D + -0x1b < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0x1b) * 4) = (int)uStack_5c;
  }
  if (((in_R8D + -0x1b == in_R9D + -1) && (-1 < in_EDX + 0x1b)) && (in_EDX + 0x1b < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0x1b) * 4) = (int)uStack_5c;
  }
  if (((in_EDX + 0x1c == in_ECX + -1) && (-1 < in_R8D + -0x1c)) && (in_R8D + -0x1c < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0x1c) * 4) = (int)uStack_5d;
  }
  if (((in_R8D + -0x1c == in_R9D + -1) && (-1 < in_EDX + 0x1c)) && (in_EDX + 0x1c < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0x1c) * 4) = (int)uStack_5d;
  }
  if (((in_EDX + 0x1d == in_ECX + -1) && (-1 < in_R8D + -0x1d)) && (in_R8D + -0x1d < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0x1d) * 4) = (int)uStack_5e;
  }
  if (((in_R8D + -0x1d == in_R9D + -1) && (-1 < in_EDX + 0x1d)) && (in_EDX + 0x1d < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0x1d) * 4) = (int)uStack_5e;
  }
  if (((in_EDX + 0x1e == in_ECX + -1) && (-1 < in_R8D + -0x1e)) && (in_R8D + -0x1e < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0x1e) * 4) = (int)uStack_5f;
  }
  if (((in_R8D + -0x1e == in_R9D + -1) && (-1 < in_EDX + 0x1e)) && (in_EDX + 0x1e < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0x1e) * 4) = (int)uStack_5f;
  }
  if (((in_EDX + 0x1f == in_ECX + -1) && (-1 < in_R8D + -0x1f)) && (in_R8D + -0x1f < in_R9D)) {
    *(int *)(in_RDI + (long)(in_R8D + -0x1f) * 4) = (int)local_60;
  }
  if (((in_R8D + -0x1f == in_R9D + -1) && (-1 < in_EDX + 0x1f)) && (in_EDX + 0x1f < in_ECX)) {
    *(int *)(in_RSI + (long)(in_EDX + 0x1f) * 4) = (int)local_60;
  }
  return;
}

Assistant:

static inline void arr_store_rowcol(
        int *row,
        int *col,
        __m128i vWH,
        int32_t i,
        int32_t s1Len,
        int32_t j,
        int32_t s2Len)
{
    if (i+0 == s1Len-1 && 0 <= j-0 && j-0 < s2Len) {
        row[j-0] = (int8_t)_mm_extract_epi8(vWH, 15);
    }
    if (j-0 == s2Len-1 && 0 <= i+0 && i+0 < s1Len) {
        col[(i+0)] = (int8_t)_mm_extract_epi8(vWH, 15);
    }
    if (i+1 == s1Len-1 && 0 <= j-1 && j-1 < s2Len) {
        row[j-1] = (int8_t)_mm_extract_epi8(vWH, 14);
    }
    if (j-1 == s2Len-1 && 0 <= i+1 && i+1 < s1Len) {
        col[(i+1)] = (int8_t)_mm_extract_epi8(vWH, 14);
    }
    if (i+2 == s1Len-1 && 0 <= j-2 && j-2 < s2Len) {
        row[j-2] = (int8_t)_mm_extract_epi8(vWH, 13);
    }
    if (j-2 == s2Len-1 && 0 <= i+2 && i+2 < s1Len) {
        col[(i+2)] = (int8_t)_mm_extract_epi8(vWH, 13);
    }
    if (i+3 == s1Len-1 && 0 <= j-3 && j-3 < s2Len) {
        row[j-3] = (int8_t)_mm_extract_epi8(vWH, 12);
    }
    if (j-3 == s2Len-1 && 0 <= i+3 && i+3 < s1Len) {
        col[(i+3)] = (int8_t)_mm_extract_epi8(vWH, 12);
    }
    if (i+4 == s1Len-1 && 0 <= j-4 && j-4 < s2Len) {
        row[j-4] = (int8_t)_mm_extract_epi8(vWH, 11);
    }
    if (j-4 == s2Len-1 && 0 <= i+4 && i+4 < s1Len) {
        col[(i+4)] = (int8_t)_mm_extract_epi8(vWH, 11);
    }
    if (i+5 == s1Len-1 && 0 <= j-5 && j-5 < s2Len) {
        row[j-5] = (int8_t)_mm_extract_epi8(vWH, 10);
    }
    if (j-5 == s2Len-1 && 0 <= i+5 && i+5 < s1Len) {
        col[(i+5)] = (int8_t)_mm_extract_epi8(vWH, 10);
    }
    if (i+6 == s1Len-1 && 0 <= j-6 && j-6 < s2Len) {
        row[j-6] = (int8_t)_mm_extract_epi8(vWH, 9);
    }
    if (j-6 == s2Len-1 && 0 <= i+6 && i+6 < s1Len) {
        col[(i+6)] = (int8_t)_mm_extract_epi8(vWH, 9);
    }
    if (i+7 == s1Len-1 && 0 <= j-7 && j-7 < s2Len) {
        row[j-7] = (int8_t)_mm_extract_epi8(vWH, 8);
    }
    if (j-7 == s2Len-1 && 0 <= i+7 && i+7 < s1Len) {
        col[(i+7)] = (int8_t)_mm_extract_epi8(vWH, 8);
    }
    if (i+8 == s1Len-1 && 0 <= j-8 && j-8 < s2Len) {
        row[j-8] = (int8_t)_mm_extract_epi8(vWH, 7);
    }
    if (j-8 == s2Len-1 && 0 <= i+8 && i+8 < s1Len) {
        col[(i+8)] = (int8_t)_mm_extract_epi8(vWH, 7);
    }
    if (i+9 == s1Len-1 && 0 <= j-9 && j-9 < s2Len) {
        row[j-9] = (int8_t)_mm_extract_epi8(vWH, 6);
    }
    if (j-9 == s2Len-1 && 0 <= i+9 && i+9 < s1Len) {
        col[(i+9)] = (int8_t)_mm_extract_epi8(vWH, 6);
    }
    if (i+10 == s1Len-1 && 0 <= j-10 && j-10 < s2Len) {
        row[j-10] = (int8_t)_mm_extract_epi8(vWH, 5);
    }
    if (j-10 == s2Len-1 && 0 <= i+10 && i+10 < s1Len) {
        col[(i+10)] = (int8_t)_mm_extract_epi8(vWH, 5);
    }
    if (i+11 == s1Len-1 && 0 <= j-11 && j-11 < s2Len) {
        row[j-11] = (int8_t)_mm_extract_epi8(vWH, 4);
    }
    if (j-11 == s2Len-1 && 0 <= i+11 && i+11 < s1Len) {
        col[(i+11)] = (int8_t)_mm_extract_epi8(vWH, 4);
    }
    if (i+12 == s1Len-1 && 0 <= j-12 && j-12 < s2Len) {
        row[j-12] = (int8_t)_mm_extract_epi8(vWH, 3);
    }
    if (j-12 == s2Len-1 && 0 <= i+12 && i+12 < s1Len) {
        col[(i+12)] = (int8_t)_mm_extract_epi8(vWH, 3);
    }
    if (i+13 == s1Len-1 && 0 <= j-13 && j-13 < s2Len) {
        row[j-13] = (int8_t)_mm_extract_epi8(vWH, 2);
    }
    if (j-13 == s2Len-1 && 0 <= i+13 && i+13 < s1Len) {
        col[(i+13)] = (int8_t)_mm_extract_epi8(vWH, 2);
    }
    if (i+14 == s1Len-1 && 0 <= j-14 && j-14 < s2Len) {
        row[j-14] = (int8_t)_mm_extract_epi8(vWH, 1);
    }
    if (j-14 == s2Len-1 && 0 <= i+14 && i+14 < s1Len) {
        col[(i+14)] = (int8_t)_mm_extract_epi8(vWH, 1);
    }
    if (i+15 == s1Len-1 && 0 <= j-15 && j-15 < s2Len) {
        row[j-15] = (int8_t)_mm_extract_epi8(vWH, 0);
    }
    if (j-15 == s2Len-1 && 0 <= i+15 && i+15 < s1Len) {
        col[(i+15)] = (int8_t)_mm_extract_epi8(vWH, 0);
    }
}